

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O1

void __thiscall Excel::Book::onCell(Book *this,size_t sheetIdx,Formula *formula)

{
  ulong uVar1;
  short sVar2;
  undefined8 uVar3;
  pointer pwVar4;
  pointer pvVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  Sheet *this_00;
  long lVar8;
  long lVar9;
  iterator it;
  pointer this_01;
  long lVar10;
  undefined4 uStack_6c;
  long *local_60 [2];
  long local_50 [2];
  undefined4 local_40;
  
  this_00 = sheet(this,sheetIdx);
  lVar8 = (long)formula->m_row;
  sVar2 = formula->m_column;
  uVar7 = *(undefined8 *)formula;
  uVar6 = *(undefined4 *)&formula->m_doubleValue;
  uVar3 = *(undefined8 *)((long)&formula->m_doubleValue + 5);
  uStack_6c._0_1_ = (undefined1)*(undefined4 *)((long)&formula->m_doubleValue + 4);
  uStack_6c._1_3_ = (undefined3)uVar3;
  local_60[0] = local_50;
  pwVar4 = (formula->m_stringValue)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)local_60,pwVar4,pwVar4 + (formula->m_stringValue)._M_string_length);
  local_40._0_2_ = formula->m_row;
  local_40._2_2_ = formula->m_column;
  if ((ulong)(((long)(this_00->m_cells).
                     super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->m_cells).
                     super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
      lVar8 + 1U) {
    std::
    vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
    ::resize(&this_00->m_cells,lVar8 + 1U);
  }
  this_01 = (this_00->m_cells).
            super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (long)sVar2 + 1;
  if ((ulong)(((long)this_01[lVar8].super__Vector_base<Excel::Cell,_std::allocator<Excel::Cell>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)this_01[lVar8].super__Vector_base<Excel::Cell,_std::allocator<Excel::Cell>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7) < uVar1) {
    if (this_00->m_columnsCount < uVar1) {
      this_00->m_columnsCount = uVar1;
      pvVar5 = (this_00->m_cells).
               super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (; this_01 != pvVar5; this_01 = this_01 + 1) {
        std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::resize
                  (this_01,this_00->m_columnsCount);
      }
    }
    else {
      std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::resize
                ((this_00->m_cells).
                 super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,this_00->m_columnsCount);
    }
  }
  lVar9 = *(long *)&(this_00->m_cells).
                    super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar8].
                    super__Vector_base<Excel::Cell,_std::allocator<Excel::Cell>_>._M_impl;
  lVar10 = (long)sVar2 * 0x70;
  lVar8 = lVar9 + lVar10;
  *(undefined8 *)(lVar8 + 0x35) = uVar3;
  *(undefined8 *)(lVar8 + 0x28) = uVar7;
  *(ulong *)(lVar8 + 0x30) = CONCAT44(uStack_6c,uVar6);
  std::__cxx11::wstring::_M_assign((wstring *)(lVar8 + 0x40));
  lVar9 = lVar9 + lVar10;
  *(undefined4 *)(lVar9 + 0x60) = local_40;
  *(undefined1 *)(lVar9 + 0x68) = 0;
  *(undefined4 *)(lVar9 + 0x6c) = 3;
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  return;
}

Assistant:

inline void
Book::onCell( size_t sheetIdx, const Formula & formula )
{
	sheet( sheetIdx )->setCell( formula.getRow(), formula.getColumn(), formula );
}